

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

CodeGeneratorResponse *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::compiler::CodeGeneratorResponse>
          (Arena *arena)

{
  CodeGeneratorResponse *pCVar1;
  
  if (arena == (Arena *)0x0) {
    pCVar1 = (CodeGeneratorResponse *)operator_new(0x40);
    (pCVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
    (pCVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__CodeGeneratorResponse_004d1168;
    pCVar1->_has_bits_ = (uint32_t  [1])0x0;
    pCVar1->_cached_size_ = (atomic<int>)0x0;
    (pCVar1->file_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  }
  else {
    pCVar1 = (CodeGeneratorResponse *)
             AllocateAlignedWithHook
                       (arena,0x40,(type_info *)&compiler::CodeGeneratorResponse::typeinfo);
    (pCVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
    (pCVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__CodeGeneratorResponse_004d1168;
    pCVar1->_has_bits_ = (uint32_t  [1])0x0;
    pCVar1->_cached_size_ = (atomic<int>)0x0;
    (pCVar1->file_).super_RepeatedPtrFieldBase.arena_ = arena;
  }
  (pCVar1->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (pCVar1->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (pCVar1->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (pCVar1->error_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  pCVar1->supported_features_ = 0;
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }